

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

calendar * __thiscall booster::locale::calendar::operator=(calendar *this,calendar *other)

{
  abstract_calendar *paVar1;
  calendar *in_RSI;
  calendar *in_RDI;
  
  if (in_RDI != in_RSI) {
    paVar1 = hold_ptr<booster::locale::abstract_calendar>::operator->(&in_RSI->impl_);
    (**paVar1->_vptr_abstract_calendar)();
    hold_ptr<booster::locale::abstract_calendar>::reset
              ((hold_ptr<booster::locale::abstract_calendar> *)in_RSI,(abstract_calendar *)in_RDI);
    std::locale::operator=(&in_RDI->locale_,&in_RSI->locale_);
    std::__cxx11::string::operator=((string *)&in_RDI->tz_,(string *)&in_RSI->tz_);
  }
  return in_RDI;
}

Assistant:

calendar const &calendar::operator = (calendar const &other) 
{
    if(this !=&other) {
        impl_.reset(other.impl_->clone());
        locale_ = other.locale_;
        tz_ = other.tz_;
    }
    return *this;
}